

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void dc_store_16xh(uint16_t *dst,ptrdiff_t stride,int height,__m128i *dc)

{
  undefined1 auVar1 [16];
  undefined4 local_ac;
  undefined8 local_98;
  int i;
  __m128i dc_dup;
  __m128i dc_dup_lo;
  __m128i *dc_local;
  int height_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  auVar1 = pshuflw((undefined1  [16])*dc,(undefined1  [16])*dc,0);
  local_98 = auVar1._0_8_;
  dc_dup[0] = (longlong)dst;
  for (local_ac = 0; local_ac < height; local_ac = local_ac + 1) {
    *(undefined8 *)dc_dup[0] = local_98;
    *(undefined8 *)(dc_dup[0] + 8) = local_98;
    *(undefined8 *)(dc_dup[0] + 0x10) = local_98;
    *(undefined8 *)(dc_dup[0] + 0x18) = local_98;
    dc_dup[0] = stride * 2 + dc_dup[0];
  }
  return;
}

Assistant:

static inline void dc_store_16xh(uint16_t *dst, ptrdiff_t stride, int height,
                                 const __m128i *dc) {
  const __m128i dc_dup_lo = _mm_shufflelo_epi16(*dc, 0);
  const __m128i dc_dup = _mm_unpacklo_epi64(dc_dup_lo, dc_dup_lo);
  int i;
  for (i = 0; i < height; ++i, dst += stride) {
    _mm_store_si128((__m128i *)dst, dc_dup);
    _mm_store_si128((__m128i *)(dst + 8), dc_dup);
  }
}